

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformation::GetOSDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  ostream *poVar1;
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,(this->Implementation->OSName)._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(this->Implementation->OSRelease)._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(this->Implementation->OSVersion)._M_dataplus._M_p);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetOSDescription()
{
  std::ostringstream oss;
  oss
    << this->GetOSName()
    << " "
    << this->GetOSRelease()
    << " "
    << this->GetOSVersion();

  return oss.str();
}